

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

bool __thiscall Rml::DataViewAttribute::Update(DataViewAttribute *this,DataModel *model)

{
  char cVar1;
  bool bVar2;
  String *name;
  Element *element_00;
  DataExpression *this_00;
  Variant *this_01;
  bool local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Variant *local_c8;
  Variant *attribute;
  undefined1 local_a0 [8];
  String value;
  DataExpressionInterface expr_interface;
  Element *element;
  Variant variant;
  bool result;
  String *attribute_name;
  DataModel *model_local;
  DataViewAttribute *this_local;
  
  name = DataViewCommon::GetModifier_abi_cxx11_(&this->super_DataViewCommon);
  variant.data[0x1f] = '\0';
  Variant::Variant((Variant *)&element);
  element_00 = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface
            ((DataExpressionInterface *)((long)&value.field_2 + 8),model,element_00,(Event *)0x0);
  if (element_00 != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar2 = DataExpression::Run(this_00,(DataExpressionInterface *)((long)&value.field_2 + 8),
                                (Variant *)&element);
    if (bVar2) {
      ::std::__cxx11::string::string((string *)&attribute);
      Variant::Get<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 (Variant *)&element,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attribute);
      ::std::__cxx11::string::~string((string *)&attribute);
      this_01 = Element::GetAttribute(element_00,name);
      local_141 = true;
      local_c8 = this_01;
      if (this_01 != (Variant *)0x0) {
        ::std::__cxx11::string::string((string *)&local_108);
        Variant::Get<std::__cxx11::string>(&local_e8,this_01,&local_108);
        local_141 = ::std::operator!=(&local_e8,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a0);
        ::std::__cxx11::string::~string((string *)&local_e8);
        ::std::__cxx11::string::~string((string *)&local_108);
      }
      if (local_141 != false) {
        Element::SetAttribute<std::__cxx11::string>
                  (element_00,name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
        variant.data[0x1f] = '\x01';
      }
      ::std::__cxx11::string::~string((string *)local_a0);
    }
  }
  cVar1 = variant.data[0x1f];
  Variant::~Variant((Variant *)&element);
  return (bool)(cVar1 & 1);
}

Assistant:

bool DataViewAttribute::Update(DataModel& model)
{
	const String& attribute_name = GetModifier();
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const String value = variant.Get<String>();
		const Variant* attribute = element->GetAttribute(attribute_name);

		if (!attribute || attribute->Get<String>() != value)
		{
			element->SetAttribute(attribute_name, value);
			result = true;
		}
	}
	return result;
}